

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::renderSourceIter(CopyImageTest *this)

{
  ostringstream *this_00;
  TestLog *log;
  State *rng;
  ObjectWrapper *pOVar1;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  ScopedLogSection sourceSection;
  string local_1d0;
  MessageBuilder local_1b0;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Source image verify.",&local_1d9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Source image verify.",&local_1da);
  tcu::ScopedLogSection::ScopedLogSection(&sourceSection,log,(string *)&local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  rng = this->m_state;
  pOVar1 = rng->srcImage;
  this_00 = &local_1b0.m_str;
  local_1b0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Verifying source image.");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  render((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
         ((this->super_TestCase).m_context)->m_renderCtx,&this->m_state->textureRenderer,
         &rng->results,&rng->rng,pOVar1->m_object,&rng->srcImageLevels,&this->m_srcImageInfo,
         VERIFY_NONE);
  tcu::ScopedLogSection::~ScopedLogSection(&sourceSection);
  return;
}

Assistant:

void CopyImageTest::renderSourceIter (void)
{
	TestLog&						log					= m_testCtx.getLog();
	const tcu::ScopedLogSection		sourceSection		(log, "Source image verify.", "Source image verify.");

	de::Random&						rng					= m_state->rng;
	tcu::ResultCollector&			results				= m_state->results;
	glu::ObjectWrapper&				srcImage			= *m_state->srcImage;
	vector<ArrayBuffer<deUint8> >&	srcImageLevels		= m_state->srcImageLevels;

	log << TestLog::Message << "Verifying source image." << TestLog::EndMessage;

	render(m_testCtx, m_context.getRenderContext(), m_state->textureRenderer, results, rng, *srcImage, srcImageLevels, m_srcImageInfo, VERIFY_NONE);
}